

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::JaroSimilarityFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunction fun;
  LogicalType list_type;
  ScalarFunctionSet *jaro;
  allocator_type *in_stack_fffffffffffff8b8;
  ScalarFunction *pSVar3;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff8c0;
  ScalarFunction *pSVar4;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffff8c8;
  LogicalType *__f;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff8d4;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff8dc;
  ScalarFunction *pSVar7;
  LogicalType *local_6b8;
  LogicalType *local_698;
  LogicalType local_550 [24];
  undefined1 local_538 [32];
  LogicalType local_518 [32];
  LogicalType *local_4f8;
  LogicalType local_4f0 [24];
  LogicalType local_4d8 [24];
  LogicalType local_4c0 [24];
  LogicalType *local_4a8;
  undefined8 local_4a0;
  undefined1 local_498 [24];
  ScalarFunction local_480 [2];
  LogicalType local_230 [24];
  undefined1 local_218 [32];
  LogicalType local_1f8 [32];
  LogicalType *local_1d8;
  LogicalType local_1d0 [24];
  LogicalType local_1b8 [24];
  LogicalType *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [24];
  ScalarFunction local_178;
  LogicalType local_40 [24];
  LogicalType local_28 [31];
  byte local_9;
  
  local_9 = 0;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_40,VARCHAR);
  duckdb::LogicalType::LIST(local_28);
  duckdb::LogicalType::~LogicalType(local_40);
  local_1d8 = local_1d0;
  duckdb::LogicalType::LogicalType(local_1d8,VARCHAR);
  local_1d8 = local_1b8;
  duckdb::LogicalType::LogicalType(local_1d8,VARCHAR);
  local_1a0 = local_1d0;
  local_198 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe9f930);
  iVar1._M_len._0_4_ = in_stack_fffffffffffff8d0;
  iVar1._M_array = (iterator)in_stack_fffffffffffff8c8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffff8d4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffff8c0,iVar1,in_stack_fffffffffffff8b8);
  duckdb::LogicalType::LogicalType(local_1f8,DOUBLE);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),in_stack_fffffffffffff8c8
            );
  duckdb::LogicalType::LogicalType(local_230,INVALID);
  __f = local_230;
  pSVar7 = (ScalarFunction *)0x0;
  uVar6 = 0;
  uVar5 = 0;
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_178,local_190,local_1f8,local_218,0);
  duckdb::LogicalType::~LogicalType(local_230);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe9fa0d);
  duckdb::LogicalType::~LogicalType(local_1f8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe9fa27);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe9fa34);
  local_698 = (LogicalType *)&local_1a0;
  do {
    local_698 = local_698 + -0x18;
    duckdb::LogicalType::~LogicalType(local_698);
  } while (local_698 != local_1d0);
  ScalarFunction::ScalarFunction(pSVar7,(ScalarFunction *)CONCAT44(in_stack_fffffffffffff8dc,uVar6))
  ;
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  local_4f8 = local_4f0;
  duckdb::LogicalType::LogicalType(local_4f8,VARCHAR);
  local_4f8 = local_4d8;
  duckdb::LogicalType::LogicalType(local_4f8,VARCHAR);
  local_4f8 = local_4c0;
  duckdb::LogicalType::LogicalType(local_4f8,DOUBLE);
  local_4a8 = local_4f0;
  local_4a0 = 3;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe9fb46);
  iVar2._M_len._0_4_ = uVar5;
  iVar2._M_array = __f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffff8d4;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar4,iVar2,(allocator_type *)pSVar3);
  duckdb::LogicalType::LogicalType(local_518,DOUBLE);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff8d4,uVar5),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)__f);
  duckdb::LogicalType::LogicalType(local_550,INVALID);
  pSVar7 = (ScalarFunction *)0x0;
  uVar5 = 0;
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(local_480,local_498,local_518,local_538,0);
  ScalarFunction::operator=(pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  duckdb::LogicalType::~LogicalType(local_550);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe9fc47);
  duckdb::LogicalType::~LogicalType(local_518);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe9fc61);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe9fc6e);
  local_6b8 = (LogicalType *)&local_4a8;
  do {
    local_6b8 = local_6b8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_6b8);
  } while (local_6b8 != local_4f0);
  ScalarFunction::ScalarFunction(pSVar7,(ScalarFunction *)CONCAT44(in_stack_fffffffffffff8dc,uVar5))
  ;
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  local_9 = 1;
  ScalarFunction::~ScalarFunction(pSVar4);
  duckdb::LogicalType::~LogicalType(local_28);
  if ((local_9 & 1) == 0) {
    ScalarFunctionSet::~ScalarFunctionSet((ScalarFunctionSet *)0xea0087);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet JaroSimilarityFun::GetFunctions() {
	ScalarFunctionSet jaro;

	const auto list_type = LogicalType::LIST(LogicalType::VARCHAR);
	auto fun = ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::DOUBLE, JaroFunction);
	jaro.AddFunction(fun);

	fun = ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                     JaroFunction);
	jaro.AddFunction(fun);
	return jaro;
}